

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

void boost::filesystem::detail::copy_file(path *from,path *to,copy_option option,error_code *ec)

{
  int iVar1;
  int iVar2;
  void *__buf;
  int *piVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  long lVar6;
  allocator<char> local_112;
  allocator<char> local_111;
  path *local_110;
  error_code *local_108;
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  stat64 local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100,(from->m_pathname)._M_dataplus._M_p,&local_111);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,(to->m_pathname)._M_dataplus._M_p,&local_112);
  __buf = operator_new__(0x8000);
  local_110 = to;
  local_108 = ec;
  iVar1 = open64((char *)local_100[0],0);
  if (iVar1 < 0) {
LAB_0010bd2c:
    operator_delete__(__buf);
  }
  else {
    iVar2 = stat64((char *)local_100[0],&local_c0);
    if (iVar2 != 0) {
      close(iVar1);
      goto LAB_0010bd2c;
    }
    iVar2 = open64((char *)local_e0[0],(uint)(option == fail_if_exists) << 7 | 0x241,
                   (ulong)local_c0.st_mode);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      close(iVar1);
      *piVar3 = iVar2;
      goto LAB_0010bd2c;
    }
    do {
      sVar4 = read(iVar1,__buf,0x8000);
      sVar5 = sVar4;
      if (sVar4 < 1) break;
      lVar6 = 0;
      do {
        if (sVar4 - lVar6 == 0 || sVar4 < lVar6) {
          __assert_fail("sz_read - sz_write > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                        ,0x1ca,
                        "bool (anonymous namespace)::copy_file_api(const std::string &, const std::string &, bool)"
                       );
        }
        sVar5 = write(iVar2,(void *)((long)__buf + lVar6),sVar4 - lVar6);
        if (sVar5 < 0) break;
        if (sVar5 == 0) {
          __assert_fail("sz > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                        ,0x1d5,
                        "bool (anonymous namespace)::copy_file_api(const std::string &, const std::string &, bool)"
                       );
        }
        lVar6 = lVar6 + sVar5;
        sVar5 = sVar4;
      } while (lVar6 < sVar4);
    } while (0 < sVar5);
    iVar1 = close(iVar1);
    iVar2 = close(iVar2);
    operator_delete__(__buf);
    if (((-1 < sVar5) && (-1 < iVar2)) && (iVar2 = 0, -1 < iVar1)) goto LAB_0010bd3b;
  }
  piVar3 = __errno_location();
  iVar2 = *piVar3;
LAB_0010bd3b:
  anon_unknown.dwarf_59c2::error(iVar2,from,local_110,local_108,"boost::filesystem::copy_file");
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void copy_file(const path& from, const path& to, copy_option option, error_code* ec)
  {
    error(!BOOST_COPY_FILE(from.c_str(), to.c_str(),
      option == fail_if_exists) ? BOOST_ERRNO : 0,
        from, to, ec, "boost::filesystem::copy_file");
  }